

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O2

uint Dar_CutTruthStretch(uint uTruth,int nVars,uint Phase)

{
  int iVar;
  int iVar1;
  uint uVar2;
  
  iVar1 = nVars + -1;
  for (uVar2 = 3; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    iVar = iVar1;
    if ((Phase >> (uVar2 & 0x1f) & 1) != 0) {
      for (; iVar < (int)uVar2; iVar = iVar + 1) {
        uTruth = Dar_CutTruthSwapAdjacentVars(uTruth,iVar);
      }
      iVar1 = iVar1 + -1;
    }
  }
  if (iVar1 != -1) {
    __assert_fail("Var == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                  ,0x1e0,"unsigned int Dar_CutTruthStretch(unsigned int, int, unsigned int)");
  }
  return uTruth;
}

Assistant:

static inline unsigned Dar_CutTruthStretch( unsigned uTruth, int nVars, unsigned Phase )
{
    int i, k, Var = nVars - 1;
    for ( i = 3; i >= 0; i-- )
        if ( Phase & (1 << i) )
        {
            for ( k = Var; k < i; k++ )
                uTruth = Dar_CutTruthSwapAdjacentVars( uTruth, k );
            Var--;
        }
    assert( Var == -1 );
    return uTruth;
}